

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O0

spv_result_t spvtools::val::FunctionPass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  spv_result_t sVar2;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpFunction) {
    sVar2 = anon_unknown_2::ValidateFunction(_,inst);
  }
  else if (OVar1 == OpFunctionParameter) {
    sVar2 = anon_unknown_2::ValidateFunctionParameter(_,inst);
  }
  else {
    if (OVar1 != OpFunctionCall) {
      return SPV_SUCCESS;
    }
    sVar2 = anon_unknown_2::ValidateFunctionCall(_,inst);
  }
  if (sVar2 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t FunctionPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpFunction:
      if (auto error = ValidateFunction(_, inst)) return error;
      break;
    case spv::Op::OpFunctionParameter:
      if (auto error = ValidateFunctionParameter(_, inst)) return error;
      break;
    case spv::Op::OpFunctionCall:
      if (auto error = ValidateFunctionCall(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}